

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O1

bool dxil_spv::get_constant_int(Value *value,uint32_t *const_value)

{
  ValueKind VVar1;
  Constant *this;
  APInt *this_00;
  uint64_t uVar2;
  Constant *this_01;
  
  if (value == (Value *)0x0) {
    this_01 = (Constant *)0x0;
  }
  else {
    this = (Constant *)LLVMBC::Internal::resolve_proxy(value);
    VVar1 = LLVMBC::Value::get_value_kind((Value *)this);
    this_01 = (Constant *)0x0;
    if (VVar1 == ConstantInt) {
      this_01 = this;
    }
  }
  if (this_01 != (Constant *)0x0) {
    this_00 = LLVMBC::Constant::getUniqueInteger(this_01);
    uVar2 = LLVMBC::APInt::getZExtValue(this_00);
    *const_value = (uint32_t)uVar2;
  }
  return this_01 != (Constant *)0x0;
}

Assistant:

static bool get_constant_int(const llvm::Value *value, uint32_t *const_value)
{
	if (const auto *c = llvm::dyn_cast<llvm::ConstantInt>(value))
	{
		*const_value = uint32_t(c->getUniqueInteger().getZExtValue());
		return true;
	}
	else
		return false;
}